

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Float pbrt::SampleTent(Float u,Float radius)

{
  undefined1 auVar1 [16];
  int iVar2;
  Float *in_R8;
  float fVar3;
  undefined1 auVar4 [16];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined1 auVar5 [16];
  Float u_local;
  float local_2c;
  Float local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined1 local_18 [16];
  undefined8 local_8;
  
  auVar4._8_4_ = 0x3f000000;
  auVar4._0_8_ = 0x3f0000003f000000;
  auVar4._12_4_ = 0x3f000000;
  local_8 = vmovlps_avx(auVar4);
  u_local = u;
  local_28 = radius;
  uStack_24 = in_XMM1_Db;
  uStack_20 = in_XMM1_Dc;
  uStack_1c = in_XMM1_Dd;
  iVar2 = SampleDiscrete((pbrt *)&local_8,(span<const_float>)ZEXT816(2),u,&u_local,in_R8);
  if (iVar2 == 0) {
    auVar5._4_4_ = uStack_24;
    auVar5._0_4_ = local_28;
    auVar5._8_4_ = uStack_20;
    auVar5._12_4_ = uStack_1c;
    auVar4 = ZEXT816(0) << 0x40;
    auVar1._8_4_ = 0x80000000;
    auVar1._0_8_ = 0x8000000080000000;
    auVar1._12_4_ = 0x80000000;
    local_18 = vxorps_avx512vl(auVar5,auVar1);
    if ((u_local != 0.0) || (NAN(u_local))) {
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - u_local)),ZEXT816(0) << 0x40,
                               ZEXT416((uint)u_local));
      if (auVar4._0_4_ < 0.0) {
        local_2c = u_local;
        fVar3 = sqrtf(auVar4._0_4_);
        auVar5._4_4_ = uStack_24;
        auVar5._0_4_ = local_28;
        auVar5._8_4_ = uStack_20;
        auVar5._12_4_ = uStack_1c;
        u_local = local_2c;
      }
      else {
        auVar4 = vsqrtss_avx(auVar4,auVar4);
        fVar3 = auVar4._0_4_;
      }
      auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(u_local / (fVar3 + 0.0))));
    }
    auVar4 = vfmadd213ss_fma(auVar4,auVar5,local_18);
    fVar3 = auVar4._0_4_;
  }
  else {
    fVar3 = (1.0 - u_local) + u_local * 0.0;
    if (fVar3 < 0.0) {
      local_18._0_4_ = u_local;
      fVar3 = sqrtf(fVar3);
      u_local = (Float)local_18._0_4_;
    }
    else {
      auVar4 = vsqrtss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
      fVar3 = auVar4._0_4_;
    }
    auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(u_local / (fVar3 + 1.0))));
    fVar3 = auVar4._0_4_ * local_28;
  }
  return fVar3;
}

Assistant:

PBRT_CPU_GPU
inline Float SampleTent(Float u, Float radius) {
    if (SampleDiscrete({0.5f, 0.5f}, u, nullptr, &u) == 0)
        return -radius + radius * SampleLinear(u, 0, 1);
    else
        return radius * SampleLinear(u, 1, 0);
}